

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall FxStringCast::FxStringCast(FxStringCast *this,FxExpression *x)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,&x->ScriptPosition);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_StringCast;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxStringCast_0070f6e8;
  this->basex = x;
  (this->super_FxExpression).ValueType = (PType *)TypeString;
  return;
}

Assistant:

FxStringCast::FxStringCast(FxExpression *x)
	: FxExpression(EFX_StringCast, x->ScriptPosition)
{
	basex = x;
	ValueType = TypeString;
}